

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaRetime.c
# Opt level: O0

void Gia_ManRetimeDup_rec(Gia_Man_t *pNew,Gia_Obj_t *pObj)

{
  int iVar1;
  int iLit1;
  uint uVar2;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *pNew_local;
  
  if (pObj->Value == 0xffffffff) {
    iVar1 = Gia_ObjIsAnd(pObj);
    if (iVar1 == 0) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaRetime.c"
                    ,0x68,"void Gia_ManRetimeDup_rec(Gia_Man_t *, Gia_Obj_t *)");
    }
    pGVar3 = Gia_ObjFanin0(pObj);
    Gia_ManRetimeDup_rec(pNew,pGVar3);
    pGVar3 = Gia_ObjFanin1(pObj);
    Gia_ManRetimeDup_rec(pNew,pGVar3);
    iVar1 = Gia_ObjFanin0Copy(pObj);
    iLit1 = Gia_ObjFanin1Copy(pObj);
    uVar2 = Gia_ManHashAnd(pNew,iVar1,iLit1);
    pObj->Value = uVar2;
  }
  return;
}

Assistant:

void Gia_ManRetimeDup_rec( Gia_Man_t * pNew, Gia_Obj_t * pObj )
{
    if ( ~pObj->Value )
        return;
    assert( Gia_ObjIsAnd(pObj) );
    Gia_ManRetimeDup_rec( pNew, Gia_ObjFanin0(pObj) );
    Gia_ManRetimeDup_rec( pNew, Gia_ObjFanin1(pObj) );
    pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
}